

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.cpp
# Opt level: O0

void xercesc_4_0::DatatypeValidator::storeDV(XSerializeEngine *serEng,DatatypeValidator *dv)

{
  ValidatorType i;
  DVHashTable *this;
  XMLCh *pXVar1;
  DatatypeValidator *pDVar2;
  DatatypeValidator *dv_local;
  XSerializeEngine *serEng_local;
  
  if (dv == (DatatypeValidator *)0x0) {
    XSerializeEngine::operator<<(serEng,-3);
  }
  else {
    this = DatatypeValidatorFactory::getBuiltInRegistry();
    pXVar1 = getTypeLocalName(dv);
    pDVar2 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                       (this,pXVar1);
    if (dv == pDVar2) {
      XSerializeEngine::operator<<(serEng,-1);
      pXVar1 = getTypeLocalName(dv);
      XSerializeEngine::writeString(serEng,pXVar1,0,false);
    }
    else {
      XSerializeEngine::operator<<(serEng,-2);
      i = getType(dv);
      XSerializeEngine::operator<<(serEng,i);
      operator<<(serEng,&dv->super_XSerializable);
    }
  }
  return;
}

Assistant:

void DatatypeValidator::storeDV(XSerializeEngine&        serEng
                              , DatatypeValidator* const dv)
{
    if (dv)
    {
        //builtIndv
        if (dv == DatatypeValidatorFactory::getBuiltInRegistry()->get(dv->getTypeLocalName()))
        {
            serEng<<DV_BUILTIN;
            serEng.writeString(dv->getTypeLocalName());
        }
        else
        {
            serEng<<DV_NORMAL;
            serEng<<(int) dv->getType();
            serEng<<dv;
        }
    }
    else
    {
        serEng<<DV_ZERO;
    }

}